

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

SinkCombineResultType __thiscall
duckdb::PhysicalHashJoin::Combine
          (PhysicalHashJoin *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  optional_idx *this_00;
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  pointer pJVar3;
  type this_01;
  pointer this_02;
  QueryProfiler *this_03;
  type this_04;
  type this_05;
  pointer this_06;
  type other;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_40;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  this_00 = &pLVar2[0x14].partition_info.min_batch_index;
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                       *)this_00);
  this_01 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator*(&pJVar3->sink_collection);
  PartitionedTupleData::FlushAppendState(this_01,(PartitionedTupleDataAppendState *)(pLVar2 + 1));
  local_40._M_device = &(pGVar1->super_StateWithBlockableTasks).lock;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  ::std::
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>,std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>>
            ((vector<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>,std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>>>
              *)&pGVar1[2].super_StateWithBlockableTasks.lock,
             (unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *)
             this_00);
  if ((pointer)(*(long *)((long)&pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base.
                                 _M_mutex + 8) -
                pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align >>
               3) ==
      pGVar1[1].super_StateWithBlockableTasks.blocked_tasks.
      super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
      super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_02 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
              ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                            *)((long)&pGVar1[1].super_StateWithBlockableTasks.lock.
                                      super___mutex_base._M_mutex + 8));
    TemporaryMemoryState::SetZero(this_02);
  }
  this_03 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,(PhysicalOperator *)this);
  QueryProfiler::Flush(this_03,&context->thread->profiler);
  if (((this->super_PhysicalComparisonJoin).filter_pushdown.
       super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl !=
       (JoinFilterPushdownInfo *)0x0) &&
     (*(char *)((long)&pGVar1[2].super_StateWithBlockableTasks.blocked_tasks.
                       super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       .
                       super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       ._M_impl.super__Vector_impl_data + 0x11) == '\0')) {
    unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
    ::operator->(&(this->super_PhysicalComparisonJoin).filter_pushdown);
    this_04 = unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
              ::operator*((unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
                           *)&pGVar1[2].state);
    this_05 = unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
              ::operator*((unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
                           *)&pLVar2[0x14].partition_info.partition_data);
    this_06 = unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
              ::operator->(&this_04->global_aggregate_state);
    other = unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>,_true>
            ::operator*(&this_05->local_aggregate_state);
    GlobalUngroupedAggregateState::Combine(this_06,other);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalHashJoin::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<HashJoinGlobalSinkState>();
	auto &lstate = input.local_state.Cast<HashJoinLocalSinkState>();

	lstate.hash_table->GetSinkCollection().FlushAppendState(lstate.append_state);
	auto guard = gstate.Lock();
	gstate.local_hash_tables.push_back(std::move(lstate.hash_table));
	if (gstate.local_hash_tables.size() == gstate.active_local_states) {
		// Set to 0 until PrepareFinalize
		gstate.temporary_memory_state->SetZero();
	}

	auto &client_profiler = QueryProfiler::Get(context.client);
	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);
	if (filter_pushdown && !gstate.skip_filter_pushdown) {
		filter_pushdown->Combine(*gstate.global_filter_state, *lstate.local_filter_state);
	}

	return SinkCombineResultType::FINISHED;
}